

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2926b4::sessionT11Fixture::createSession
          (sessionT11Fixture *this,int heartBtInt,int startDay,int endDay)

{
  string *psVar1;
  string *senderCompID;
  string *targetCompID;
  BeginString *beginString;
  Session *pSVar2;
  allocator<char> local_b49;
  STRING local_b48;
  BeginString local_b28;
  StringField local_ad0;
  undefined1 local_a71;
  anon_class_8_1_8991fb9c local_a70;
  function<FIX::UtcTimeStamp_()> local_a68;
  allocator<char> local_a41;
  string local_a40;
  string local_a20;
  allocator<char> local_9f9;
  STRING local_9f8;
  ApplVerID local_9d8;
  allocator<char> local_979;
  string local_978;
  string local_958;
  allocator<char> local_931;
  STRING local_930;
  ApplVerID local_910;
  allocator<char> local_8b1;
  string local_8b0;
  string local_890;
  allocator<char> local_869;
  STRING local_868;
  ApplVerID local_848;
  allocator<char> local_7e9;
  string local_7e8;
  string local_7c8;
  undefined1 local_7a8 [8];
  DataDictionaryProvider provider;
  TimeRange sessionTime;
  allocator<char> local_321;
  string local_320;
  allocator<char> local_2f9;
  STRING local_2f8;
  StringField local_2d8;
  allocator<char> local_279;
  STRING local_278;
  StringField local_258;
  allocator<char> local_1e9;
  STRING local_1e8;
  StringField local_1c8;
  undefined1 local_170 [8];
  SessionID sessionID;
  int endDay_local;
  int startDay_local;
  int heartBtInt_local;
  sessionT11Fixture *this_local;
  
  sessionID.m_frozenString.field_2._12_4_ = endDay;
  if ((this->object != (Session *)0x0) && (this->object != (Session *)0x0)) {
    (**(code **)(*(long *)this->object + 8))();
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"FIXT.1.1",&local_1e9);
  FIX::BeginString::BeginString((BeginString *)&local_1c8,&local_1e8);
  psVar1 = FIX::StringField::operator_cast_to_string_(&local_1c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,"TW",&local_279);
  FIX::SenderCompID::SenderCompID((SenderCompID *)&local_258,&local_278);
  senderCompID = FIX::StringField::operator_cast_to_string_(&local_258);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,"ISLD",&local_2f9);
  FIX::TargetCompID::TargetCompID((TargetCompID *)&local_2d8,&local_2f8);
  targetCompID = FIX::StringField::operator_cast_to_string_(&local_2d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_320,"",&local_321);
  FIX::SessionID::SessionID((SessionID *)local_170,psVar1,senderCompID,targetCompID,&local_320);
  std::__cxx11::string::~string((string *)&local_320);
  std::allocator<char>::~allocator(&local_321);
  FIX::TargetCompID::~TargetCompID((TargetCompID *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::allocator<char>::~allocator(&local_2f9);
  FIX::SenderCompID::~SenderCompID((SenderCompID *)&local_258);
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator(&local_279);
  FIX::BeginString::~BeginString((BeginString *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  FIX::TimeRange::TimeRange
            ((TimeRange *)&provider.field_0x438,&(this->super_TestCallback).startTime,
             &(this->super_TestCallback).endTime,startDay,sessionID.m_frozenString.field_2._12_4_);
  FIX::DataDictionaryProvider::DataDictionaryProvider((DataDictionaryProvider *)local_7a8);
  beginString = FIX::SessionID::getBeginString((SessionID *)local_170);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7e8,"FIXT11",&local_7e9);
  FIX::TestSettings::pathForSpec(&local_7c8,&local_7e8);
  FIX::DataDictionaryProvider::addTransportDataDictionary
            ((DataDictionaryProvider *)local_7a8,beginString,&local_7c8);
  std::__cxx11::string::~string((string *)&local_7c8);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::allocator<char>::~allocator(&local_7e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_868,"7",&local_869);
  FIX::ApplVerID::ApplVerID(&local_848,&local_868);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8b0,"FIX50",&local_8b1);
  FIX::TestSettings::pathForSpec(&local_890,&local_8b0);
  FIX::DataDictionaryProvider::addApplicationDataDictionary
            ((DataDictionaryProvider *)local_7a8,&local_848,&local_890);
  std::__cxx11::string::~string((string *)&local_890);
  std::__cxx11::string::~string((string *)&local_8b0);
  std::allocator<char>::~allocator(&local_8b1);
  FIX::ApplVerID::~ApplVerID(&local_848);
  std::__cxx11::string::~string((string *)&local_868);
  std::allocator<char>::~allocator(&local_869);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_930,"4",&local_931);
  FIX::ApplVerID::ApplVerID(&local_910,&local_930);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_978,"FIX42",&local_979);
  FIX::TestSettings::pathForSpec(&local_958,&local_978);
  FIX::DataDictionaryProvider::addApplicationDataDictionary
            ((DataDictionaryProvider *)local_7a8,&local_910,&local_958);
  std::__cxx11::string::~string((string *)&local_958);
  std::__cxx11::string::~string((string *)&local_978);
  std::allocator<char>::~allocator(&local_979);
  FIX::ApplVerID::~ApplVerID(&local_910);
  std::__cxx11::string::~string((string *)&local_930);
  std::allocator<char>::~allocator(&local_931);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9f8,"2",&local_9f9);
  FIX::ApplVerID::ApplVerID(&local_9d8,&local_9f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a40,"FIX40",&local_a41);
  FIX::TestSettings::pathForSpec(&local_a20,&local_a40);
  FIX::DataDictionaryProvider::addApplicationDataDictionary
            ((DataDictionaryProvider *)local_7a8,&local_9d8,&local_a20);
  std::__cxx11::string::~string((string *)&local_a20);
  std::__cxx11::string::~string((string *)&local_a40);
  std::allocator<char>::~allocator(&local_a41);
  FIX::ApplVerID::~ApplVerID(&local_9d8);
  std::__cxx11::string::~string((string *)&local_9f8);
  std::allocator<char>::~allocator(&local_9f9);
  pSVar2 = (Session *)operator_new(0x878);
  local_a71 = 1;
  local_a70.this = this;
  std::function<FIX::UtcTimeStamp()>::
  function<(anonymous_namespace)::sessionT11Fixture::createSession(int,int,int)::_lambda()_1_,void>
            ((function<FIX::UtcTimeStamp()> *)&local_a68,&local_a70);
  FIX::Session::Session
            (pSVar2,&local_a68,&(this->super_TestCallback).super_NullApplication,&this->factory,
             local_170,local_7a8,&provider.field_0x438,heartBtInt,0);
  local_a71 = 0;
  this->object = pSVar2;
  std::function<FIX::UtcTimeStamp_()>::~function(&local_a68);
  pSVar2 = this->object;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b48,"FIX.5.0",&local_b49);
  FIX::BeginString::BeginString(&local_b28,&local_b48);
  FIX::Message::toApplVerID((ApplVerID *)&local_ad0,&local_b28);
  psVar1 = FIX::StringField::operator_cast_to_string_(&local_ad0);
  FIX::Session::setSenderDefaultApplVerID(pSVar2,psVar1);
  FIX::ApplVerID::~ApplVerID((ApplVerID *)&local_ad0);
  FIX::BeginString::~BeginString(&local_b28);
  std::__cxx11::string::~string((string *)&local_b48);
  std::allocator<char>::~allocator(&local_b49);
  FIX::Session::setResponder(this->object,(Responder *)this);
  FIX::DataDictionaryProvider::~DataDictionaryProvider((DataDictionaryProvider *)local_7a8);
  FIX::TimeRange::~TimeRange((TimeRange *)&provider.field_0x438);
  FIX::SessionID::~SessionID((SessionID *)local_170);
  return;
}

Assistant:

virtual void createSession(int heartBtInt, int startDay = -1, int endDay = -1) {
    if (object) {
      delete object;
    }

    SessionID sessionID(BeginString("FIXT.1.1"), SenderCompID("TW"), TargetCompID("ISLD"));
    TimeRange sessionTime(startTime, endTime, startDay, endDay);

    DataDictionaryProvider provider;
    provider.addTransportDataDictionary(sessionID.getBeginString(), FIX::TestSettings::pathForSpec("FIXT11"));
    provider.addApplicationDataDictionary(ApplVerID(ApplVerID_FIX50), FIX::TestSettings::pathForSpec("FIX50"));
    provider.addApplicationDataDictionary(ApplVerID(ApplVerID_FIX42), FIX::TestSettings::pathForSpec("FIX42"));
    provider.addApplicationDataDictionary(ApplVerID(ApplVerID_FIX40), FIX::TestSettings::pathForSpec("FIX40"));

    object = new Session([this]() { return now; }, *this, factory, sessionID, provider, sessionTime, heartBtInt, 0);
    object->setSenderDefaultApplVerID(FIX::Message::toApplVerID(BeginString("FIX.5.0")));
    object->setResponder(this);
  }